

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsWindowsPELinker::ScanDependencies
          (cmBinUtilsWindowsPELinker *this,string *file,TargetType param_2)

{
  long *plVar1;
  cmRuntimeDependencyArchive *this_00;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  pointer pWVar6;
  ulong uVar7;
  allocator<WinPEDependency> *in_RCX;
  ulong uVar8;
  allocator<WinPEDependency> *paVar9;
  WinPEDependency *__args;
  WinPEDependency *__args_00;
  WinPEDependency *__last;
  string *__n;
  WinPEDependency *pWVar10;
  pointer pbVar11;
  _Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *p_Var12;
  long lVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  pointer name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  bool bVar16;
  bool resolved;
  bool unique;
  string path;
  string origin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  needed;
  bool local_122;
  bool local_121;
  pointer local_120;
  vector<WinPEDependency,_std::allocator<WinPEDependency>_> local_118;
  pointer local_f8;
  string local_f0;
  cmBinUtilsWindowsPELinker *local_d0;
  WinPEDependency local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string *local_68;
  WinPEDependency *local_60;
  pointer local_58;
  long local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = file;
  local_d0 = this;
  iVar5 = (*((this->Tool)._M_t.
             super___uniq_ptr_impl<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
             .super__Head_base<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_false>.
            _M_head_impl)->_vptr_cmBinUtilsWindowsPEGetRuntimeDependenciesTool[2])();
  if ((char)iVar5 == '\0') {
    bVar16 = false;
  }
  else {
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var12 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
              ((long)local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    if ((ulong)p_Var12 >> 0x39 != 0) {
      std::__throw_length_error("vector::reserve");
    }
    local_68 = file;
    if (p_Var12 != (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)0x0) {
      pWVar6 = std::_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>::_M_allocate
                         (p_Var12,(size_t)__n);
      std::
      __uninitialized_copy_a<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency_const*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                ((WinPEDependency *)0x0,(WinPEDependency *)0x0,pWVar6,in_RCX);
      local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pWVar6 + (long)p_Var12;
      local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
      super__Vector_impl_data._M_finish = pWVar6;
    }
    lVar13 = (long)local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (0 < lVar13) {
      local_120 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      local_f8 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      __last = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pbVar11 = local_88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        paVar15 = &local_f0.field_2;
        local_c8.Original._M_dataplus._M_p = (pointer)&local_c8.Original.field_2;
        local_f0._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
        paVar14 = &pbVar11->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == paVar14) {
          local_f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
          local_f0._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        local_c8.Original._M_string_length = pbVar11->_M_string_length;
        (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
        pbVar11->_M_string_length = 0;
        (pbVar11->field_2)._M_local_buf[0] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == paVar15) {
          local_c8.Original.field_2._8_8_ = local_f0.field_2._8_8_;
        }
        else {
          local_c8.Original._M_dataplus._M_p = local_f0._M_dataplus._M_p;
        }
        local_c8.Original.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
        local_f0._M_string_length = 0;
        local_f0.field_2._M_allocated_capacity =
             local_f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pWVar10 = &local_c8;
        local_f0._M_dataplus._M_p = (pointer)paVar15;
        cmsys::SystemTools::LowerCase(&local_c8.LowerCase,&pWVar10->Original);
        local_50 = lVar13;
        if (__last == local_f8) {
          lVar13 = (long)__last - (long)local_120;
          if (lVar13 == 0x7fffffffffffffc0) {
            local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = local_f8;
            local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
            super__Vector_impl_data._M_start = local_120;
            local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
            super__Vector_impl_data._M_finish = __last;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar7 = lVar13 >> 6;
          uVar8 = uVar7;
          if (__last == local_120) {
            uVar8 = 1;
          }
          p_Var12 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                    (uVar8 + uVar7);
          if ((_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)0x1fffffffffffffe <
              p_Var12) {
            p_Var12 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                      0x1ffffffffffffff;
          }
          paVar9 = (allocator<WinPEDependency> *)(uVar8 + uVar7);
          if (CARRY8(uVar8,uVar7)) {
            p_Var12 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                      0x1ffffffffffffff;
          }
          pWVar6 = std::_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>::_M_allocate
                             (p_Var12,(size_t)pWVar10);
          std::
          allocator_traits<std::allocator<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>>
          ::
          construct<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                    ((allocator_type *)(lVar13 + (long)pWVar6),&local_c8,__args_00);
          local_60 = std::
                     __uninitialized_copy_a<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency_const*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                               (local_120,__last,pWVar6,paVar9);
          local_58 = pWVar6;
          if (__last != local_120) {
            paVar14 = &(local_120->LowerCase).field_2;
            do {
              plVar1 = (long *)(((string *)(paVar14 + -1))->_M_dataplus)._M_p;
              if (paVar14 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar1) {
                operator_delete(plVar1,paVar14->_M_allocated_capacity + 1);
              }
              if (paVar14 + -2 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)paVar14[-3]._M_allocated_capacity) {
                operator_delete((long *)paVar14[-3]._M_allocated_capacity,
                                paVar14[-2]._M_allocated_capacity + 1);
              }
              pWVar10 = (WinPEDependency *)(paVar14 + 1);
              paVar14 = paVar14 + 4;
            } while (pWVar10 != __last);
          }
          if (local_120 != (WinPEDependency *)0x0) {
            operator_delete(local_120,(long)local_f8 - (long)local_120);
          }
          local_f8 = local_58 + (long)p_Var12;
          local_120 = local_58;
          __last = local_60;
        }
        else {
          std::
          allocator_traits<std::allocator<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>>
          ::
          construct<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                    ((allocator_type *)__last,&local_c8,__args);
        }
        lVar3 = local_50;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.LowerCase._M_dataplus._M_p != &local_c8.LowerCase.field_2) {
          operator_delete(local_c8.LowerCase._M_dataplus._M_p,
                          local_c8.LowerCase.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.Original._M_dataplus._M_p != &local_c8.Original.field_2) {
          operator_delete(local_c8.Original._M_dataplus._M_p,
                          local_c8.Original.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        __last = __last + 1;
        pbVar11 = pbVar11 + 1;
        lVar13 = lVar3 + -1;
      } while (1 < lVar3);
      local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_f8;
      local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
      super__Vector_impl_data._M_start = local_120;
      local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
      super__Vector_impl_data._M_finish = __last;
    }
    cmsys::SystemTools::GetFilenamePath(&local_c8.Original,local_68);
    pWVar6 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl
             .super__Vector_impl_data._M_finish;
    bVar16 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl
             .super__Vector_impl_data._M_start ==
             local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (!bVar16) {
      name = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl
             .super__Vector_impl_data._M_start;
      do {
        bVar4 = cmRuntimeDependencyArchive::IsPreExcluded
                          ((local_d0->super_cmBinUtilsLinker).Archive,&name->LowerCase);
        if (!bVar4) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          local_f0._M_string_length = 0;
          local_f0.field_2._M_allocated_capacity =
               local_f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_122 = false;
          ResolveDependency(local_d0,&name->LowerCase,&local_c8.Original,&local_f0,&local_122);
          this_00 = (local_d0->super_cmBinUtilsLinker).Archive;
          if (local_122 == true) {
            bVar4 = cmRuntimeDependencyArchive::IsPostExcluded(this_00,&local_f0);
            if (!bVar4) {
              pcVar2 = (char *)(name->Original)._M_string_length;
              std::__cxx11::string::replace
                        ((ulong)&local_f0,local_f0._M_string_length - (long)pcVar2,pcVar2,
                         (ulong)(name->Original)._M_dataplus._M_p);
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmRuntimeDependencyArchive::AddResolvedPath
                        ((local_d0->super_cmBinUtilsLinker).Archive,&name->Original,&local_f0,
                         &local_121,&local_48);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_48);
              if ((local_121 == true) &&
                 (iVar5 = (*(local_d0->super_cmBinUtilsLinker)._vptr_cmBinUtilsLinker[3])
                                    (local_d0,&local_f0,2), (char)iVar5 == '\0')) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                break;
              }
            }
          }
          else {
            cmRuntimeDependencyArchive::AddUnresolvedPath(this_00,&name->Original);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
        }
        name = name + 1;
        bVar16 = name == pWVar6;
      } while (!bVar16);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.Original._M_dataplus._M_p != &local_c8.Original.field_2) {
      operator_delete(local_c8.Original._M_dataplus._M_p,
                      local_c8.Original.field_2._M_allocated_capacity + 1);
    }
    std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>::~vector(&local_118);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return bVar16;
}

Assistant:

bool cmBinUtilsWindowsPELinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType /* unused */)
{
  std::vector<std::string> needed;
  if (!this->Tool->GetFileInfo(file, needed)) {
    return false;
  }

  struct WinPEDependency
  {
    WinPEDependency(std::string o)
      : Original(std::move(o))
      , LowerCase(cmSystemTools::LowerCase(Original))
    {
    }
    std::string const Original;
    std::string const LowerCase;
  };

  std::vector<WinPEDependency> depends;
  depends.reserve(needed.size());
  std::move(needed.begin(), needed.end(), std::back_inserter(depends));
  std::string origin = cmSystemTools::GetFilenamePath(file);

  for (auto const& lib : depends) {
    if (!this->Archive->IsPreExcluded(lib.LowerCase)) {
      std::string path;
      bool resolved = false;
      if (!this->ResolveDependency(lib.LowerCase, origin, path, resolved)) {
        return false;
      }
      if (resolved) {
        if (!this->Archive->IsPostExcluded(path)) {
#ifdef _WIN32
          ReplaceWithActualNameCasing(path);
#else
          path.replace(path.end() - lib.Original.size(), path.end(),
                       lib.Original);
#endif
          bool unique;
          this->Archive->AddResolvedPath(lib.Original, path, unique);
          if (unique &&
              !this->ScanDependencies(path, cmStateEnums::SHARED_LIBRARY)) {
            return false;
          }
        }
      } else {
        this->Archive->AddUnresolvedPath(lib.Original);
      }
    }
  }

  return true;
}